

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir,
          cmFindBaseDebugState *debug)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference in_path;
  string *local_370;
  allocator<char> local_329;
  string local_328;
  undefined1 local_301;
  undefined1 local_300 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  Glob globIt;
  cmAlphaNum local_260;
  undefined1 local_230 [8];
  string glob;
  string local_1e8;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  undefined1 local_168 [8];
  string intPath;
  cmAlphaNum local_118;
  undefined1 local_e8 [8];
  string fpath;
  string local_98 [32];
  long local_78;
  size_type pos;
  string frameWorkName;
  string fileName;
  cmFindBaseDebugState *debug_local;
  string *dir_local;
  string *file_local;
  cmFindPathCommand *this_local;
  string *fheader;
  
  std::__cxx11::string::string((string *)(frameWorkName.field_2._M_local_buf + 8),(string *)file);
  std::__cxx11::string::string((string *)&pos);
  local_78 = std::__cxx11::string::find((char)&frameWorkName + '\x18',0x2f);
  if (local_78 != -1) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)((long)&frameWorkName.field_2 + 8));
    std::__cxx11::string::operator=((string *)(frameWorkName.field_2._M_local_buf + 8),local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::operator=((string *)&pos,(string *)file);
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)((long)&fpath.field_2 + 8),(ulong)&pos);
    std::__cxx11::string::operator=((string *)&pos,(string *)(fpath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
    lVar2 = std::__cxx11::string::find((char)&pos,0x2f);
    if (lVar2 != -1) {
      std::__cxx11::string::operator=
                ((string *)(frameWorkName.field_2._M_local_buf + 8),(string *)file);
      std::__cxx11::string::clear();
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_118,dir);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&intPath.field_2 + 8),(string *)&pos);
      cmStrCat<char[11]>((string *)local_e8,&local_118,(cmAlphaNum *)((long)&intPath.field_2 + 8),
                         (char (*) [11])".framework");
      cmAlphaNum::cmAlphaNum(&local_198,(string *)local_e8);
      cmAlphaNum::cmAlphaNum(&local_1c8,"/Headers/");
      cmStrCat<std::__cxx11::string>
                ((string *)local_168,&local_198,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&frameWorkName.field_2 + 8));
      bVar1 = cmsys::SystemTools::FileExists((string *)local_168);
      if (bVar1) {
        if ((this->IncludeFileInPath & 1U) == 0) {
          local_370 = (string *)local_e8;
        }
        else {
          local_370 = (string *)local_168;
        }
        bVar1 = cmFindBase::Validate(&this->super_cmFindBase,local_370);
        if (!bVar1) goto LAB_00508c19;
        std::__cxx11::string::string((string *)&local_1e8);
        cmFindBaseDebugState::FoundAt(debug,(string *)local_168,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        if ((this->IncludeFileInPath & 1U) == 0) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_e8);
          bVar1 = true;
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_168);
          bVar1 = true;
        }
      }
      else {
LAB_00508c19:
        std::__cxx11::string::string((string *)(glob.field_2._M_local_buf + 8));
        cmFindBaseDebugState::FailedAt
                  (debug,(string *)local_168,(string *)(glob.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(glob.field_2._M_local_buf + 8));
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_e8);
      if (bVar1) goto LAB_00508fab;
    }
  }
  cmAlphaNum::cmAlphaNum(&local_260,dir);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&globIt.ListDirs,"*.framework/Headers/");
  cmStrCat<std::__cxx11::string>((string *)local_230,&local_260,(cmAlphaNum *)&globIt.ListDirs,file)
  ;
  cmsys::Glob::Glob((Glob *)&files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmsys::Glob::FindFiles
            ((Glob *)&files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_230,
             (GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_
                  ((Glob *)&files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_300,__x);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_300);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_329);
    std::allocator<char>::~allocator(&local_329);
  }
  else {
    local_301 = 0;
    in_path = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_300,0);
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,in_path);
    std::__cxx11::string::string((string *)&local_328);
    cmFindBaseDebugState::FoundAt(debug,__return_storage_ptr__,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    if ((this->IncludeFileInPath & 1U) == 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
    local_301 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_300);
  cmsys::Glob::~Glob((Glob *)&files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_230);
LAB_00508fab:
  std::__cxx11::string::~string((string *)&pos);
  std::__cxx11::string::~string((string *)(frameWorkName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(
  std::string const& file, std::string const& dir,
  cmFindBaseDebugState& debug) const
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName.clear();
    }
    if (!frameWorkName.empty()) {
      std::string fpath = cmStrCat(dir, frameWorkName, ".framework");
      std::string intPath = cmStrCat(fpath, "/Headers/", fileName);
      if (cmSystemTools::FileExists(intPath) &&
          this->Validate(this->IncludeFileInPath ? intPath : fpath)) {
        debug.FoundAt(intPath);
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
      debug.FailedAt(intPath);
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = cmStrCat(dir, "*.framework/Headers/", file);
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    debug.FoundAt(fheader);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }

  // No frameworks matched the glob, so nothing more to add to debug.FailedAt()
  return "";
}